

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-type.cpp
# Opt level: O2

Up __thiscall yactfr::FixedLengthSignedIntegerType::_clone(FixedLengthSignedIntegerType *this)

{
  __uniq_ptr_impl<const_yactfr::FixedLengthSignedIntegerType,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
  _Var1;
  long in_RSI;
  ByteOrder local_58;
  uint local_54;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_50;
  __uniq_ptr_impl<const_yactfr::FixedLengthSignedIntegerType,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
  local_48 [2];
  _Rb_tree_color local_38;
  BitOrder local_34;
  
  local_54 = *(uint *)(in_RSI + 0xc);
  local_58 = *(ByteOrder *)(in_RSI + 0x18);
  local_34 = *(BitOrder *)(in_RSI + 0x1c);
  local_38 = *(_Rb_tree_color *)(in_RSI + 0x20);
  local_48[1]._M_t.
  super__Tuple_impl<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
  .super__Head_base<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_false>._M_head_impl._4_4_ =
       *(undefined4 *)(in_RSI + 0x28);
  internal::tryCloneAttrs((MapItem *)&local_50);
  std::
  make_unique<yactfr::FixedLengthSignedIntegerType_const,unsigned_int,unsigned_int,yactfr::ByteOrder,yactfr::BitOrder,yactfr::DisplayBase,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<long_long,true>>>>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)local_48,&local_54,&local_58,&local_34,&local_38,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<long_long,_true>_>_>_>
              *)((long)&local_48[1]._M_t.
                        super__Tuple_impl<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
                        .super__Head_base<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_false>.
                        _M_head_impl + 4),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (in_RSI + 0x30));
  _Var1._M_t.
  super__Tuple_impl<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
  .super__Head_base<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_false>._M_head_impl =
       local_48[0]._M_t.
       super__Tuple_impl<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
       .super__Head_base<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_false>._M_head_impl;
  local_48[0]._M_t.
  super__Tuple_impl<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
  .super__Head_base<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_false>._M_head_impl =
       (tuple<const_yactfr::FixedLengthSignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
        )(_Tuple_impl<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
          )0x0;
  (this->super_FixedLengthIntegerType<long_long>).super_FixedLengthBitArrayType.super_ScalarDataType
  .super_DataType._vptr_DataType =
       (_func_int **)
       _Var1._M_t.
       super__Tuple_impl<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
       .super__Head_base<0UL,_const_yactfr::FixedLengthSignedIntegerType_*,_false>._M_head_impl;
  std::
  unique_ptr<const_yactfr::FixedLengthSignedIntegerType,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
  ::~unique_ptr((unique_ptr<const_yactfr::FixedLengthSignedIntegerType,_std::default_delete<const_yactfr::FixedLengthSignedIntegerType>_>
                 *)local_48);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_50);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthSignedIntegerType::_clone() const
{
    return FixedLengthSignedIntegerType::create(this->alignment(), this->length(),
                                                this->byteOrder(), this->bitOrder(),
                                                this->preferredDisplayBase(), this->mappings(),
                                                internal::tryCloneAttrs(this->attributes()));
}